

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lib.cpp
# Opt level: O0

void __thiscall LibClass::~LibClass(LibClass *this)

{
  LibInternalClass *this_00;
  LibClass *this_local;
  
  if (this->m_DoublePtr != (double *)0x0) {
    operator_delete(this->m_DoublePtr,8);
  }
  this_00 = (LibInternalClass *)this->m_InnerMember;
  if (this_00 != (LibInternalClass *)0x0) {
    LibInternalClass::~LibInternalClass(this_00);
    operator_delete(this_00,8);
  }
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~vector(&this->m_Vec);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

LibClass::~LibClass() {
    delete m_DoublePtr;
    delete (LibInternalClass*)m_InnerMember;
}